

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

void __thiscall soul::Value::PackedData::negateAs<std::complex<double>>(PackedData *this)

{
  undefined8 in_RSI;
  complex<double> cVar1;
  complex<double> local_30 [2];
  PackedData *local_10;
  PackedData *this_local;
  
  local_10 = this;
  getAs<std::complex<double>>(this);
  cVar1 = std::operator-(local_30);
  cVar1._M_value._0_8_ = in_RSI;
  setAs<std::complex<double>>(this,cVar1);
  return;
}

Assistant:

void negateAs() const                   { setAs (-getAs<Primitive>()); }